

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O0

void __thiscall pmx::PmxModel::Read(PmxModel *this,istream *stream)

{
  int iVar1;
  ostream *poVar2;
  type this_00;
  type piVar3;
  type this_01;
  type this_02;
  type this_03;
  type this_04;
  type this_05;
  type this_06;
  type this_07;
  int local_15c;
  int i_8;
  int local_14c;
  int i_7;
  int local_13c;
  int i_6;
  int local_12c;
  int i_5;
  int local_11c;
  int i_4;
  int local_10c;
  int i_3;
  pmx local_f0 [36];
  int local_cc;
  int i_2;
  int local_bc;
  int i_1;
  int local_ac;
  int i;
  pmx local_a0 [32];
  pmx local_80 [32];
  pmx local_60 [32];
  pmx local_40 [36];
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  istream *piStack_18;
  char magic [4];
  istream *stream_local;
  PmxModel *this_local;
  
  piStack_18 = stream;
  std::istream::read((char *)stream,(long)&local_1c);
  if ((((local_1c != 'P') || (local_1b != 'M')) || (local_1a != 'X')) || (local_19 != ' ')) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"invalid magic number.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __cxa_rethrow();
  }
  std::istream::read((char *)piStack_18,(long)this);
  if (((this->version != 2.0) || (NAN(this->version))) &&
     ((this->version != 2.1 || (NAN(this->version))))) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"this is not ver2.0 or ver2.1 but ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->version);
    poVar2 = std::operator<<(poVar2,".");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __cxa_rethrow();
  }
  PmxSetting::Read(&this->setting,piStack_18);
  ReadString_abi_cxx11_(local_40,piStack_18,(this->setting).encoding);
  std::__cxx11::string::operator=((string *)&this->model_name,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  ReadString_abi_cxx11_(local_60,piStack_18,(this->setting).encoding);
  std::__cxx11::string::operator=((string *)&this->model_english_name,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  ReadString_abi_cxx11_(local_80,piStack_18,(this->setting).encoding);
  std::__cxx11::string::operator=((string *)&this->model_comment,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  ReadString_abi_cxx11_(local_a0,piStack_18,(this->setting).encoding);
  std::__cxx11::string::operator=((string *)&this->model_english_comment,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::istream::read((char *)piStack_18,(long)&this->vertex_count);
  std::make_unique<pmx::PmxVertex[]>((size_t)&stack0xffffffffffffff58);
  std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::operator=
            (&this->vertices,
             (unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_> *)
             &stack0xffffffffffffff58);
  std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_> *)
             &stack0xffffffffffffff58);
  for (local_ac = 0; local_ac < this->vertex_count; local_ac = local_ac + 1) {
    this_00 = std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::operator[]
                        (&this->vertices,(long)local_ac);
    PmxVertex::Read(this_00,piStack_18,&this->setting);
  }
  std::istream::read((char *)piStack_18,(long)&this->index_count);
  std::make_unique<int[]>((size_t)&stack0xffffffffffffff48);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::operator=
            (&this->indices,
             (unique_ptr<int[],_std::default_delete<int[]>_> *)&stack0xffffffffffffff48);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)&stack0xffffffffffffff48);
  for (local_bc = 0; local_bc < this->index_count; local_bc = local_bc + 1) {
    iVar1 = ReadIndex(piStack_18,(uint)(this->setting).vertex_index_size);
    piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->indices,(long)local_bc);
    *piVar3 = iVar1;
  }
  std::istream::read((char *)piStack_18,(long)&this->texture_count);
  std::make_unique<std::__cxx11::string[]>((size_t)&stack0xffffffffffffff38);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::operator=(&this->textures,
              (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
               *)&stack0xffffffffffffff38);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                 *)&stack0xffffffffffffff38);
  for (local_cc = 0; local_cc < this->texture_count; local_cc = local_cc + 1) {
    ReadString_abi_cxx11_(local_f0,piStack_18,(this->setting).encoding);
    this_01 = std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
              ::operator[](&this->textures,(long)local_cc);
    std::__cxx11::string::operator=((string *)this_01,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  std::istream::read((char *)piStack_18,(long)&this->material_count);
  std::make_unique<pmx::PmxMaterial[]>((size_t)&stack0xfffffffffffffef8);
  std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::operator=
            (&this->materials,
             (unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)
             &stack0xfffffffffffffef8);
  std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)
             &stack0xfffffffffffffef8);
  for (local_10c = 0; local_10c < this->material_count; local_10c = local_10c + 1) {
    this_02 = std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::
              operator[](&this->materials,(long)local_10c);
    PmxMaterial::Read(this_02,piStack_18,&this->setting);
  }
  std::istream::read((char *)piStack_18,(long)&this->bone_count);
  std::make_unique<pmx::PmxBone[]>((size_t)&stack0xfffffffffffffee8);
  std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator=
            (&this->bones,
             (unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
             &stack0xfffffffffffffee8);
  std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
             &stack0xfffffffffffffee8);
  for (local_11c = 0; local_11c < this->bone_count; local_11c = local_11c + 1) {
    this_03 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                        (&this->bones,(long)local_11c);
    PmxBone::Read(this_03,piStack_18,&this->setting);
  }
  std::istream::read((char *)piStack_18,(long)&this->morph_count);
  std::make_unique<pmx::PmxMorph[]>((size_t)&stack0xfffffffffffffed8);
  std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::operator=
            (&this->morphs,
             (unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)
             &stack0xfffffffffffffed8);
  std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)
             &stack0xfffffffffffffed8);
  for (local_12c = 0; local_12c < this->morph_count; local_12c = local_12c + 1) {
    this_04 = std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::operator[]
                        (&this->morphs,(long)local_12c);
    PmxMorph::Read(this_04,piStack_18,&this->setting);
  }
  std::istream::read((char *)piStack_18,(long)&this->frame_count);
  std::make_unique<pmx::PmxFrame[]>((size_t)&stack0xfffffffffffffec8);
  std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::operator=
            (&this->frames,
             (unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)
             &stack0xfffffffffffffec8);
  std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)
             &stack0xfffffffffffffec8);
  for (local_13c = 0; local_13c < this->frame_count; local_13c = local_13c + 1) {
    this_05 = std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::operator[]
                        (&this->frames,(long)local_13c);
    PmxFrame::Read(this_05,piStack_18,&this->setting);
  }
  std::istream::read((char *)piStack_18,(long)&this->rigid_body_count);
  std::make_unique<pmx::PmxRigidBody[]>((size_t)&stack0xfffffffffffffeb8);
  std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::operator=
            (&this->rigid_bodies,
             (unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)
             &stack0xfffffffffffffeb8);
  std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)
             &stack0xfffffffffffffeb8);
  for (local_14c = 0; local_14c < this->rigid_body_count; local_14c = local_14c + 1) {
    this_06 = std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::
              operator[](&this->rigid_bodies,(long)local_14c);
    PmxRigidBody::Read(this_06,piStack_18,&this->setting);
  }
  std::istream::read((char *)piStack_18,(long)&this->joint_count);
  std::make_unique<pmx::PmxJoint[]>((size_t)&stack0xfffffffffffffea8);
  std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::operator=
            (&this->joints,
             (unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)
             &stack0xfffffffffffffea8);
  std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)
             &stack0xfffffffffffffea8);
  for (local_15c = 0; local_15c < this->joint_count; local_15c = local_15c + 1) {
    this_07 = std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::operator[]
                        (&this->joints,(long)local_15c);
    PmxJoint::Read(this_07,piStack_18,&this->setting);
  }
  return;
}

Assistant:

void PmxModel::Read(std::istream *stream)
	{
		// マジック
		char magic[4];
		stream->read((char*) magic, sizeof(char) * 4);
		if (magic[0] != 0x50 || magic[1] != 0x4d || magic[2] != 0x58 || magic[3] != 0x20)
		{
			std::cerr << "invalid magic number." << std::endl;
			throw;
		}
		// バージョン
		stream->read((char*) &version, sizeof(float));
		if (version != 2.0f && version != 2.1f)
		{
			std::cerr << "this is not ver2.0 or ver2.1 but " << version << "." << std::endl;
			throw;
		}
		// ファイル設定
		this->setting.Read(stream);

		// モデル情報
		this->model_name = std::move(ReadString(stream, setting.encoding));
		this->model_english_name = std::move(ReadString(stream, setting.encoding));
		this->model_comment = std::move(ReadString(stream, setting.encoding));
		this->model_english_comment = std::move(ReadString(stream, setting.encoding));

		// 頂点
		stream->read((char*) &vertex_count, sizeof(int));
		this->vertices = std::make_unique<PmxVertex []>(vertex_count);
		for (int i = 0; i < vertex_count; i++)
		{
			vertices[i].Read(stream, &setting);
		}

		// 面
		stream->read((char*) &index_count, sizeof(int));
		this->indices = std::make_unique<int []>(index_count);
		for (int i = 0; i < index_count; i++)
		{
			this->indices[i] = ReadIndex(stream, setting.vertex_index_size);
		}

		// テクスチャ
		stream->read((char*) &texture_count, sizeof(int));
		this->textures = std::make_unique<utfstring []>(texture_count);
		for (int i = 0; i < texture_count; i++)
		{
			this->textures[i] = ReadString(stream, setting.encoding);
		}

		// マテリアル
		stream->read((char*) &material_count, sizeof(int));
		this->materials = std::make_unique<PmxMaterial []>(material_count);
		for (int i = 0; i < material_count; i++)
		{
			this->materials[i].Read(stream, &setting);
		}

		// ボーン
		stream->read((char*) &this->bone_count, sizeof(int));
		this->bones = std::make_unique<PmxBone []>(this->bone_count);
		for (int i = 0; i < this->bone_count; i++)
		{
			this->bones[i].Read(stream, &setting);
		}

		// モーフ
		stream->read((char*) &this->morph_count, sizeof(int));
		this->morphs = std::make_unique<PmxMorph []>(this->morph_count);
		for (int i = 0; i < this->morph_count; i++)
		{
			this->morphs[i].Read(stream, &setting);
		}

		// 表示枠
		stream->read((char*) &this->frame_count, sizeof(int));
		this->frames = std::make_unique<PmxFrame []>(this->frame_count);
		for (int i = 0; i < this->frame_count; i++)
		{
			this->frames[i].Read(stream, &setting);
		}

		// 剛体
		stream->read((char*) &this->rigid_body_count, sizeof(int));
		this->rigid_bodies = std::make_unique<PmxRigidBody []>(this->rigid_body_count);
		for (int i = 0; i < this->rigid_body_count; i++)
		{
			this->rigid_bodies[i].Read(stream, &setting);
		}

		// ジョイント
		stream->read((char*) &this->joint_count, sizeof(int));
		this->joints = std::make_unique<PmxJoint []>(this->joint_count);
		for (int i = 0; i < this->joint_count; i++)
		{
			this->joints[i].Read(stream, &setting);
		}

		//// ソフトボディ
		//if (this->version == 2.1f)
		//{
		//	stream->read((char*) &this->soft_body_count, sizeof(int));
		//	this->soft_bodies = std::make_unique<PmxSoftBody []>(this->soft_body_count);
		//	for (int i = 0; i < this->soft_body_count; i++)
		//	{
		//		this->soft_bodies[i].Read(stream, &setting);
		//	}
		//}
	}